

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__jpeg *j_00;
  stbi__jpeg *j;
  int result;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  j_00 = (stbi__jpeg *)stbi__malloc(0x4888);
  if (j_00 == (stbi__jpeg *)0x0) {
    s_local._4_4_ = stbi__err("outofmem");
  }
  else {
    memset(j_00,0,0x4888);
    j_00->s = s;
    s_local._4_4_ = stbi__jpeg_info_raw(j_00,x,y,comp);
    free(j_00);
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__jpeg_info(stbi__context *s, int *x, int *y, int *comp)
{
   int result;
   stbi__jpeg* j = (stbi__jpeg*) (stbi__malloc(sizeof(stbi__jpeg)));
   if (!j) return stbi__err("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   j->s = s;
   result = stbi__jpeg_info_raw(j, x, y, comp);
   STBI_FREE(j);
   return result;
}